

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O1

ON_MeshNgon * __thiscall ON_MeshNgonIterator::NextNgon(ON_MeshNgonIterator *this)

{
  ON_COMPONENT_INDEX *this_00;
  TYPE TVar1;
  uint uVar2;
  ON_MeshNgon *pOVar3;
  long lVar4;
  ulong uVar5;
  
  this_00 = &this->m_current_ngon_ci;
  TVar1 = (this->m_current_ngon_ci).m_type;
  if (TVar1 == mesh_ngon) {
LAB_00532b74:
    uVar2 = (this->m_current_ngon_ci).m_index;
    uVar5 = (ulong)(uVar2 + 1);
    do {
      uVar2 = uVar2 + 1;
      if (this->m_mesh_ngon_count <= uVar2) {
        ON_COMPONENT_INDEX::Set(this_00,mesh_face,-1);
        goto LAB_00532bbd;
      }
      if (uVar2 < (uint)(this->m_mesh->m_Ngon).m_count) {
        pOVar3 = (this->m_mesh->m_Ngon).m_a[uVar5];
      }
      else {
        pOVar3 = (ON_MeshNgon *)0x0;
      }
      uVar5 = uVar5 + 1;
    } while (pOVar3 == (ON_MeshNgon *)0x0);
    this->m_iterator_index = this->m_iterator_index + 1;
    (this->m_current_ngon_ci).m_index = uVar2;
  }
  else {
    if (TVar1 == mesh_face) {
LAB_00532bbd:
      uVar2 = (this->m_current_ngon_ci).m_index + 1;
      if (uVar2 < this->m_mesh_face_count) {
        uVar5 = (ulong)uVar2;
        lVar4 = uVar5 << 4;
        do {
          if (this->m_facedex_to_ngondex_map == (uint *)0x0) {
            uVar2 = 0xffffffff;
          }
          else {
            uVar2 = this->m_facedex_to_ngondex_map[uVar5];
          }
          if (this->m_mesh_ngon_count <= uVar2) {
            pOVar3 = ON_MeshNgon::NgonFromMeshFace
                               (&this->m_ngon_buffer,(uint)uVar5,
                                (uint *)((long)((this->m_mesh->m_F).m_a)->vi + lVar4));
            if (pOVar3 != (ON_MeshNgon *)0x0) {
              this->m_iterator_index = this->m_iterator_index + 1;
              (this->m_current_ngon_ci).m_index = (uint)uVar5;
              goto LAB_00532c26;
            }
          }
          uVar5 = uVar5 + 1;
          lVar4 = lVar4 + 0x10;
        } while (uVar5 < this->m_mesh_face_count);
      }
    }
    else if (TVar1 == invalid_type) {
      this->m_current_ngon = 0;
      if ((this->m_current_ngon_ci).m_index != 1) {
        return (ON_MeshNgon *)0x0;
      }
      ON_COMPONENT_INDEX::Set(this_00,mesh_ngon,-1);
      this->m_iterator_index = 0xffffffff;
      goto LAB_00532b74;
    }
    pOVar3 = (ON_MeshNgon *)0x0;
    ON_COMPONENT_INDEX::Set(this_00,invalid_type,0);
  }
LAB_00532c26:
  this->m_current_ngon = (ON__UINT_PTR)pOVar3;
  return pOVar3;
}

Assistant:

const class ON_MeshNgon* ON_MeshNgonIterator::NextNgon()
{
  unsigned int fi, ni;
  
  const class ON_MeshNgon* ngon = 0;
  switch( m_current_ngon_ci.m_type )
  {
  case ON_COMPONENT_INDEX::invalid_type:
    m_current_ngon = 0;
    if ( 1 != m_current_ngon_ci.m_index )
      break;
    m_current_ngon_ci.Set(ON_COMPONENT_INDEX::mesh_ngon,-1);
    m_iterator_index = ON_UNSET_UINT_INDEX;
    // no break here - iterator will look through ngon list

  case ON_COMPONENT_INDEX::mesh_ngon:
    for ( ni = ( -1 == m_current_ngon_ci.m_index ) ? 0 : m_current_ngon_ci.UnsignedIndex()+1;
          ni < m_mesh_ngon_count;
          ni++
        )
    {
      ngon = m_mesh->Ngon(ni);
      if ( 0 == ngon )
        continue;
      if ( ON_UNSET_UINT_INDEX == m_iterator_index )
        m_iterator_index = 0;
      else
        m_iterator_index++;
      m_current_ngon_ci.m_index = (int)ni;
      m_current_ngon = (ON__UINT_PTR)ngon;
      return ngon;
    }
    m_current_ngon_ci.Set(ON_COMPONENT_INDEX::mesh_face,-1);
    // no break here - iterator will look for mesh faces that are not part of ngons

  case ON_COMPONENT_INDEX::mesh_face:
    for ( fi = ( -1 == m_current_ngon_ci.m_index ) ? 0 : m_current_ngon_ci.UnsignedIndex()+1;
          fi < m_mesh_face_count;
          fi++
        )
    {
      ni = m_facedex_to_ngondex_map ? m_facedex_to_ngondex_map[fi] : ON_UNSET_UINT_INDEX;
      if ( ni < m_mesh_ngon_count )
        continue;
      ngon = ON_MeshNgon::NgonFromMeshFace(m_ngon_buffer,fi,(const unsigned int*)m_mesh->m_F[fi].vi);
      if ( 0 == ngon )
        continue;
      if ( ON_UNSET_UINT_INDEX == m_iterator_index )
        m_iterator_index = 0;
      else
        m_iterator_index++;
      m_current_ngon_ci.m_index = (int)fi;
      m_current_ngon = (ON__UINT_PTR)ngon;
      return ngon;
    }
    // no break here - iterator is finished

  default:
    m_current_ngon_ci.Set(ON_COMPONENT_INDEX::invalid_type,0);
    m_current_ngon = 0;
  }

  return ngon;
}